

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O2

void __thiscall MyCompiler::ConstDeclaration::ConstDeclaration(ConstDeclaration *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"ConstDeclaration",&local_31);
  AbstractAstNode::AbstractAstNode(&this->super_AbstractAstNode,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->vConstDefinition).
  super__Vector_base<MyCompiler::ConstDefinition,_std::allocator<MyCompiler::ConstDefinition>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vConstDefinition).
  super__Vector_base<MyCompiler::ConstDefinition,_std::allocator<MyCompiler::ConstDefinition>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vConstDefinition).
  super__Vector_base<MyCompiler::ConstDefinition,_std::allocator<MyCompiler::ConstDefinition>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

MyCompiler::ConstDeclaration::ConstDeclaration()
        : AbstractAstNode("ConstDeclaration")
{}